

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token)

{
  anon_struct_4_2_14fb5ae2_for_bits_ aVar1;
  ValueHolder *pVVar2;
  ValueHolder VVar3;
  _Elt_pointer ppVVar4;
  Location pCVar5;
  bool bVar6;
  _Elt_pointer ppVVar7;
  _Elt_pointer ppVVar8;
  Value decoded;
  ValueHolder local_48;
  anon_struct_4_2_14fb5ae2_for_bits_ local_40;
  undefined8 local_38;
  
  local_38 = 0;
  Value::initBasic((Value *)&local_48,nullValue,false);
  bVar6 = decodeNumber(this,token,(Value *)&local_48);
  if (bVar6) {
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar2 = &ppVVar7[-1]->value_;
    aVar1 = *(anon_struct_4_2_14fb5ae2_for_bits_ *)(pVVar2 + 1);
    *(anon_struct_4_2_14fb5ae2_for_bits_ *)(pVVar2 + 1) = local_40;
    VVar3 = *pVVar2;
    *pVVar2 = local_48;
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar8 = ppVVar7;
    if (ppVVar7 == ppVVar4) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar5 = this->begin_;
    ppVVar8[-1]->start_ = (long)token->start_ - (long)pCVar5;
    if (ppVVar7 == ppVVar4) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar7[-1]->limit_ = (long)token->end_ - (long)pCVar5;
    local_48 = VVar3;
    local_40 = aVar1;
  }
  Value::~Value((Value *)&local_48);
  return bVar6;
}

Assistant:

bool Reader::decodeNumber(Token& token) {
  Value decoded;
  if (!decodeNumber(token, decoded))
    return false;
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}